

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

char * __thiscall google::protobuf::Type::_InternalParse(Type *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  string *s;
  SourceContext *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  Option *msg_00;
  Field *msg_01;
  uint64 uVar3;
  UnknownFieldSet *unknown;
  char cVar4;
  ulong tag_00;
  uint local_44;
  Type *pTStack_40;
  uint32 tag;
  char *local_38;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pTStack_40 = this;
  local_38 = ptr;
  do {
    bVar2 = internal::ParseContext::Done(ctx,&local_38);
    if (bVar2) {
      return local_38;
    }
    local_38 = internal::ReadTag(local_38,&local_44,0);
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
    tag_00 = (ulong)local_44;
    cVar4 = (char)local_44;
    switch(local_44 >> 3) {
    case 1:
      if (cVar4 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(pTStack_40);
      local_38 = internal::InlineGreedyStringParser(s,local_38,ctx);
      bVar2 = internal::VerifyUTF8(s,"google.protobuf.Type.name");
      if (!bVar2) {
        return (char *)0x0;
      }
      cVar4 = (local_38 == (char *)0x0) * '\x02' + '\x02';
      goto LAB_0031aff9;
    case 2:
      if (cVar4 == '\x12') {
        local_38 = local_38 + -1;
        do {
          local_38 = local_38 + 1;
          msg_01 = RepeatedPtrField<google::protobuf::Field>::Add(&this->fields_);
          local_38 = internal::ParseContext::ParseMessage<google::protobuf::Field>
                               (ctx,msg_01,local_38);
          if (local_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == '\x12'));
LAB_0031afb5:
        cVar4 = '\x02';
        goto LAB_0031aff9;
      }
      break;
    case 3:
      if (cVar4 == '\x1a') {
        local_38 = local_38 + -1;
        do {
          local_38 = local_38 + 1;
          s_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(&this->oneofs_);
          local_38 = internal::InlineGreedyStringParser(s_00,local_38,ctx);
          bVar2 = internal::VerifyUTF8(s_00,"google.protobuf.Type.oneofs");
          if (!bVar2) {
            return (char *)0x0;
          }
          if (local_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == '\x1a'));
        goto LAB_0031afb5;
      }
      break;
    case 4:
      if (cVar4 == '\"') {
        local_38 = local_38 + -1;
        do {
          local_38 = local_38 + 1;
          msg_00 = RepeatedPtrField<google::protobuf::Option>::Add(&this->options_);
          local_38 = internal::ParseContext::ParseMessage<google::protobuf::Option>
                               (ctx,msg_00,local_38);
          if (local_38 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == '\"'));
        goto LAB_0031afb5;
      }
      break;
    case 5:
      if (cVar4 != '*') break;
      msg = _internal_mutable_source_context(pTStack_40);
      local_38 = internal::ParseContext::ParseMessage<google::protobuf::SourceContext>
                           (ctx,msg,local_38);
      goto LAB_0031afed;
    case 6:
      if (cVar4 == '0') {
        uVar3 = internal::ReadVarint64(&local_38);
        if (local_38 == (char *)0x0) {
          return (char *)0x0;
        }
        pTStack_40->syntax_ = (int)uVar3;
        goto LAB_0031afb5;
      }
    }
    if ((tag_00 == 0) || ((local_44 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      return local_38;
    }
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
    }
    local_38 = internal::UnknownFieldParse(tag_00,unknown,local_38,ctx);
LAB_0031afed:
    cVar4 = '\x02';
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
LAB_0031aff9:
    if (cVar4 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Type::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Type.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Field fields = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_fields(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string oneofs = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_oneofs();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Type.oneofs"));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.SourceContext source_context = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_context(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Syntax syntax = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_syntax(static_cast<PROTOBUF_NAMESPACE_ID::Syntax>(val));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}